

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O0

bpf_insn * icode_to_fcode(compiler_state_t *cstate,icode *ic,block *root,u_int *lenp)

{
  u_int uVar1;
  int iVar2;
  undefined1 local_48 [8];
  conv_state_t conv_state;
  bpf_insn *fp;
  u_int n;
  u_int *lenp_local;
  block *root_local;
  icode *ic_local;
  compiler_state_t *cstate_local;
  
  while( true ) {
    ic->cur_mark = ic->cur_mark + 1;
    uVar1 = count_stmts(ic,root);
    *lenp = uVar1;
    conv_state.ftail = (bpf_insn *)malloc((ulong)uVar1 << 3);
    if (conv_state.ftail == (bpf_insn *)0x0) {
      bpf_error(cstate,"malloc");
    }
    memset(conv_state.ftail,0,(ulong)uVar1 << 3);
    local_48 = (undefined1  [8])conv_state.ftail;
    conv_state.fstart = conv_state.ftail + uVar1;
    ic->cur_mark = ic->cur_mark + 1;
    iVar2 = convert_code_r(cstate,(conv_state_t *)local_48,ic,root);
    if (iVar2 != 0) break;
    free(conv_state.ftail);
  }
  return conv_state.ftail;
}

Assistant:

struct bpf_insn *
icode_to_fcode(compiler_state_t *cstate, struct icode *ic,
    struct block *root, u_int *lenp)
{
	u_int n;
	struct bpf_insn *fp;
	conv_state_t conv_state;

	/*
	 * Loop doing convert_code_r() until no branches remain
	 * with too-large offsets.
	 */
	while (1) {
	    unMarkAll(ic);
	    n = *lenp = count_stmts(ic, root);

	    fp = (struct bpf_insn *)malloc(sizeof(*fp) * n);
	    if (fp == NULL)
		    bpf_error(cstate, "malloc");
	    memset((char *)fp, 0, sizeof(*fp) * n);
	    conv_state.fstart = fp;
	    conv_state.ftail = fp + n;

	    unMarkAll(ic);
	    if (convert_code_r(cstate, &conv_state, ic, root))
		break;
	    free(fp);
	}

	return fp;
}